

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

unsigned_long __thiscall
flatbuffers::Table::GetField<unsigned_long>(Table *this,voffset_t field,unsigned_long defaultval)

{
  if ((field < *(ushort *)(this + -(long)*(int *)this)) &&
     ((ulong)*(ushort *)(this + ((ulong)field - (long)*(int *)this)) != 0)) {
    defaultval = *(unsigned_long *)(this + *(ushort *)(this + ((ulong)field - (long)*(int *)this)));
  }
  return defaultval;
}

Assistant:

T GetField(voffset_t field, T defaultval) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return field_offset ? ReadScalar<T>(data_ + field_offset) : defaultval;
  }